

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O1

parser_error parse_vault_rows(parser *p)

{
  char *__s1;
  uint uVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  anon_struct_24_4_1e7643cc *paVar5;
  long lVar6;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    uVar1 = parser_getuint(p,"height");
    *(char *)((long)pvVar4 + 0x22) = (char)uVar1;
    __s1 = *(char **)((long)pvVar4 + 0x18);
    paVar5 = room_builders;
    lVar6 = 0;
    do {
      iVar2 = strcmp(__s1,paVar5->name);
      if (iVar2 == 0) goto LAB_001579a9;
      lVar6 = lVar6 + 1;
      paVar5 = paVar5 + 1;
    } while (lVar6 != 0x13);
    lVar6 = 0x13;
LAB_001579a9:
    pVar3 = PARSE_ERROR_NO_ROOM_FOUND;
    if ((lVar6 != 0x13) &&
       (pVar3 = PARSE_ERROR_VAULT_TOO_BIG, (int)(uVar1 & 0xff) <= room_builders[lVar6].max_height))
    {
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_vault_rows(struct parser *p) {
	struct vault *v = parser_priv(p);
	size_t i;

	if (!v)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	v->hgt = parser_getuint(p, "height");

	/* Make sure vaults are no higher than the room profiles allow. */
	for (i = 0; i < N_ELEMENTS(room_builders); i++)
		if (streq(v->typ, room_builders[i].name))
			break;
	if (i == N_ELEMENTS(room_builders))
		return PARSE_ERROR_NO_ROOM_FOUND;
	if (v->hgt > room_builders[i].max_height)
		return PARSE_ERROR_VAULT_TOO_BIG;
	return PARSE_ERROR_NONE;
}